

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

double __thiscall llvm::detail::DoubleAPFloat::remainder(DoubleAPFloat *this,double __x,double __y)

{
  APFloat *__ptr;
  double __x_00;
  double extraout_XMM0_Qa;
  APFloat Tmp;
  anon_union_8_2_1313ab2f_for_U local_80;
  uint local_78;
  undefined1 local_70 [8];
  IEEEFloat local_68;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)local_70);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_70);
    if ((0x40 < (uint)local_68.semantics) && (local_70 != (undefined1  [8])0x0)) {
      operator_delete__((void *)local_70);
    }
    bitcastToAPInt((DoubleAPFloat *)&local_80);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_70 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_80);
    APFloat::remainder(&local_50,__x_00,__y);
    APFloat::Storage::~Storage((Storage *)(local_70 + 8));
    if ((0x40 < local_78) && ((void *)local_80.VAL != (void *)0x0)) {
      operator_delete__(local_80.pVal);
    }
    APFloat::bitcastToAPInt((APFloat *)&local_80);
    DoubleAPFloat((DoubleAPFloat *)local_70,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_80);
    if ((DoubleAPFloat *)local_70 != this) {
      __ptr = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      if (__ptr != (APFloat *)0x0) {
        std::default_delete<llvm::APFloat[]>::operator()
                  ((default_delete<llvm::APFloat[]> *)&this->Floats,__ptr);
      }
      (this->Floats)._M_t.
      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
      super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)0x0;
      DoubleAPFloat(this,(DoubleAPFloat *)local_70);
    }
    if (local_68.semantics != (fltSemantics *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)(local_70 + 8),(APFloat *)local_68.semantics);
    }
    local_68.semantics = (fltSemantics *)0x0;
    if ((0x40 < local_78) && ((void *)local_80.VAL != (void *)0x0)) {
      operator_delete__(local_80.pVal);
    }
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    return extraout_XMM0_Qa;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1034,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::remainder(const DoubleAPFloat &)");
}

Assistant:

APFloat::opStatus DoubleAPFloat::remainder(const DoubleAPFloat &RHS) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret =
      Tmp.remainder(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()));
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}